

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O2

void rlSetUniformMatrix(int locIndex,Matrix mat)

{
  float matfloat [16];
  
  matfloat[0] = mat.m0;
  matfloat[1] = mat.m1;
  matfloat[2] = mat.m2;
  matfloat[3] = mat.m3;
  matfloat[4] = mat.m4;
  matfloat[5] = mat.m5;
  matfloat[6] = mat.m6;
  matfloat[7] = mat.m7;
  matfloat[8] = mat.m8;
  matfloat[9] = mat.m9;
  matfloat[10] = mat.m10;
  matfloat[0xb] = mat.m11;
  matfloat[0xc] = mat.m12;
  matfloat[0xd] = mat.m13;
  matfloat[0xe] = mat.m14;
  matfloat[0xf] = mat.m15;
  (*glad_glUniformMatrix4fv)(locIndex,1,'\0',matfloat);
  return;
}

Assistant:

void rlSetUniformMatrix(int locIndex, Matrix mat)
{
#if defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)
    float matfloat[16] = {
        mat.m0, mat.m1, mat.m2, mat.m3,
        mat.m4, mat.m5, mat.m6, mat.m7,
        mat.m8, mat.m9, mat.m10, mat.m11,
        mat.m12, mat.m13, mat.m14, mat.m15
    };
    glUniformMatrix4fv(locIndex, 1, false, matfloat);
#endif
}